

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O3

Pass * wasm::createOptimizeAddedConstantsPropagatePass(void)

{
  _func_int **pp_Var1;
  size_type *psVar2;
  Pass *pPVar3;
  
  pPVar3 = (Pass *)operator_new(0x1a0);
  pPVar3->runner = (PassRunner *)0x0;
  (pPVar3->name)._M_dataplus._M_p = (pointer)&(pPVar3->name).field_2;
  (pPVar3->name)._M_string_length = 0;
  (pPVar3->name).field_2._M_local_buf[0] = '\0';
  (pPVar3->passArg).
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  pPVar3[1]._vptr_Pass = (_func_int **)0x0;
  pPVar3[1].runner = (PassRunner *)0x0;
  pPVar3[3]._vptr_Pass = (_func_int **)0x0;
  pPVar3[3].runner = (PassRunner *)0x0;
  pPVar3[3].name._M_dataplus._M_p = (pointer)0x0;
  pPVar3[3].name._M_string_length = 0;
  pPVar3[3].name.field_2._M_allocated_capacity = 0;
  pPVar3->_vptr_Pass = (_func_int **)&PTR__OptimizeAddedConstants_01074278;
  pPVar3[3].name.field_2._M_local_buf[8] = '\x01';
  pPVar3[3].passArg.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (pointer)0x0;
  pp_Var1 = (_func_int **)
            ((long)&pPVar3[3].passArg.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload + 0x10);
  *(undefined4 *)
   ((long)&pPVar3[3].passArg.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload + 0x10) = 0;
  *(undefined8 *)
   ((long)&pPVar3[3].passArg.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload + 0x18) = 0;
  *(_func_int ***)
   &pPVar3[3].passArg.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = pp_Var1;
  pPVar3[4]._vptr_Pass = pp_Var1;
  pPVar3[4].runner = (PassRunner *)0x0;
  psVar2 = &pPVar3[4].name._M_string_length;
  *(undefined4 *)&pPVar3[4].name._M_string_length = 0;
  pPVar3[4].name.field_2._M_allocated_capacity = 0;
  *(size_type **)((long)&pPVar3[4].name.field_2 + 8) = psVar2;
  pPVar3[4].passArg.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (pointer)psVar2;
  pPVar3[4].passArg.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = 0;
  return pPVar3;
}

Assistant:

Pass* createOptimizeAddedConstantsPropagatePass() {
  return new OptimizeAddedConstants(true);
}